

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O2

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrSpaceQueryInfoFB *value,
               string *prefix,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  PFN_xrStructureTypeToString p_Var1;
  void *value_00;
  XrSpaceFilterInfoBaseHeaderFB *pXVar2;
  bool bVar3;
  XrInstance pXVar4;
  ostream *poVar5;
  invalid_argument *piVar6;
  XrSpaceQueryInfoFB *in_stack_fffffffffffffb38;
  string excludefilter_prefix;
  string filter_prefix;
  string type_prefix;
  string timeout_prefix;
  string maxresultcount_prefix;
  string queryaction_prefix;
  string next_prefix;
  string local_3e0;
  string local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  string local_380;
  string local_360;
  string local_340;
  ostringstream oss_filter;
  uint auStack_308 [88];
  ostringstream oss_maxResultCount;
  
  PointerToHexString<XrSpaceQueryInfoFB>(in_stack_fffffffffffffb38);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &oss_maxResultCount);
  std::__cxx11::string::~string((string *)&oss_maxResultCount);
  std::__cxx11::string::append((char *)prefix);
  std::__cxx11::string::string((string *)&type_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&type_prefix);
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    std::__cxx11::to_string((string *)&oss_maxResultCount,value->type);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_maxResultCount);
    std::__cxx11::string::~string((string *)&oss_maxResultCount);
  }
  else {
    _oss_maxResultCount = (pointer)0x0;
    p_Var1 = gen_dispatch_table->StructureTypeToString;
    pXVar4 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var1)(pXVar4,value->type,(char *)&oss_maxResultCount);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (char (*) [64])&oss_maxResultCount);
  }
  std::__cxx11::string::string((string *)&next_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&next_prefix);
  value_00 = value->next;
  std::__cxx11::string::string((string *)&local_340,(string *)&next_prefix);
  bVar3 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_340,contents);
  std::__cxx11::string::~string((string *)&local_340);
  if (bVar3) {
    std::__cxx11::string::string((string *)&queryaction_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&queryaction_prefix);
    std::__cxx11::to_string((string *)&oss_maxResultCount,value->queryAction);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[21],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [21])"XrSpaceQueryActionFB",&queryaction_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_maxResultCount);
    std::__cxx11::string::~string((string *)&oss_maxResultCount);
    std::__cxx11::string::string((string *)&maxresultcount_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&maxresultcount_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_maxResultCount);
    poVar5 = std::operator<<((ostream *)&oss_maxResultCount,"0x");
    *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
         *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [9])"uint32_t",&maxresultcount_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_filter);
    std::__cxx11::string::~string((string *)&oss_filter);
    std::__cxx11::string::string((string *)&timeout_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&timeout_prefix);
    std::__cxx11::to_string((string *)&oss_filter,value->timeout);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[11],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [11])"XrDuration",&timeout_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_filter);
    std::__cxx11::string::~string((string *)&oss_filter);
    std::__cxx11::string::string((string *)&filter_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&filter_prefix);
    pXVar2 = value->filter;
    if (pXVar2 == (XrSpaceFilterInfoBaseHeaderFB *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_filter);
      *(uint *)((long)auStack_308 + *(long *)(_oss_filter + -0x18)) =
           *(uint *)((long)auStack_308 + *(long *)(_oss_filter + -0x18)) & 0xffffffb5 | 8;
      std::ostream::_M_insert<void_const*>(&oss_filter);
      std::__cxx11::stringbuf::str();
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[37],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)contents,(char (*) [37])"const XrSpaceFilterInfoBaseHeaderFB*",&filter_prefix,
                 &excludefilter_prefix);
      std::__cxx11::string::~string((string *)&excludefilter_prefix);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_filter);
    }
    else {
      std::__cxx11::string::string((string *)&local_360,(string *)&filter_prefix);
      std::__cxx11::string::string
                ((string *)&local_380,"const XrSpaceFilterInfoBaseHeaderFB*",
                 (allocator *)&oss_filter);
      bVar3 = ApiDumpOutputXrStruct(gen_dispatch_table,pXVar2,&local_360,&local_380,true,contents);
      std::__cxx11::string::~string((string *)&local_380);
      std::__cxx11::string::~string((string *)&local_360);
      if (!bVar3) {
        piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar6,"Invalid Operation");
        __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
    }
    std::__cxx11::string::string((string *)&excludefilter_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&excludefilter_prefix);
    pXVar2 = value->excludeFilter;
    if (pXVar2 == (XrSpaceFilterInfoBaseHeaderFB *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_filter);
      *(uint *)((long)auStack_308 + *(long *)(_oss_filter + -0x18)) =
           *(uint *)((long)auStack_308 + *(long *)(_oss_filter + -0x18)) & 0xffffffb5 | 8;
      std::ostream::_M_insert<void_const*>(&oss_filter);
      std::__cxx11::stringbuf::str();
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[37],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)contents,(char (*) [37])"const XrSpaceFilterInfoBaseHeaderFB*",
                 &excludefilter_prefix,&local_3a0);
      std::__cxx11::string::~string((string *)&local_3a0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_filter);
    }
    else {
      std::__cxx11::string::string((string *)&local_3c0,(string *)&excludefilter_prefix);
      std::__cxx11::string::string
                ((string *)&local_3e0,"const XrSpaceFilterInfoBaseHeaderFB*",
                 (allocator *)&oss_filter);
      bVar3 = ApiDumpOutputXrStruct(gen_dispatch_table,pXVar2,&local_3c0,&local_3e0,true,contents);
      std::__cxx11::string::~string((string *)&local_3e0);
      std::__cxx11::string::~string((string *)&local_3c0);
      if (!bVar3) {
        piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar6,"Invalid Operation");
        __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
    }
    std::__cxx11::string::~string((string *)&excludefilter_prefix);
    std::__cxx11::string::~string((string *)&filter_prefix);
    std::__cxx11::string::~string((string *)&timeout_prefix);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_maxResultCount);
    std::__cxx11::string::~string((string *)&maxresultcount_prefix);
    std::__cxx11::string::~string((string *)&queryaction_prefix);
    std::__cxx11::string::~string((string *)&next_prefix);
    std::__cxx11::string::~string((string *)&type_prefix);
    return true;
  }
  piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar6,"Invalid Operation");
  __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrSpaceQueryInfoFB* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string queryaction_prefix = prefix;
        queryaction_prefix += "queryAction";
        contents.emplace_back("XrSpaceQueryActionFB", queryaction_prefix, std::to_string(value->queryAction));
        std::string maxresultcount_prefix = prefix;
        maxresultcount_prefix += "maxResultCount";
        std::ostringstream oss_maxResultCount;
        oss_maxResultCount << "0x" << std::hex << (value->maxResultCount);
        contents.emplace_back("uint32_t", maxresultcount_prefix, oss_maxResultCount.str());
        std::string timeout_prefix = prefix;
        timeout_prefix += "timeout";
        contents.emplace_back("XrDuration", timeout_prefix, std::to_string(value->timeout));
        std::string filter_prefix = prefix;
        filter_prefix += "filter";
        if (nullptr == value->filter) {
            std::ostringstream oss_filter;
            oss_filter << std::hex << reinterpret_cast<const void*>(value->filter);
            contents.emplace_back("const XrSpaceFilterInfoBaseHeaderFB*", filter_prefix, oss_filter.str());
        } else if (!ApiDumpOutputXrStruct(gen_dispatch_table, value->filter, filter_prefix, "const XrSpaceFilterInfoBaseHeaderFB*", true, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string excludefilter_prefix = prefix;
        excludefilter_prefix += "excludeFilter";
        if (nullptr == value->excludeFilter) {
            std::ostringstream oss_excludeFilter;
            oss_excludeFilter << std::hex << reinterpret_cast<const void*>(value->excludeFilter);
            contents.emplace_back("const XrSpaceFilterInfoBaseHeaderFB*", excludefilter_prefix, oss_excludeFilter.str());
        } else if (!ApiDumpOutputXrStruct(gen_dispatch_table, value->excludeFilter, excludefilter_prefix, "const XrSpaceFilterInfoBaseHeaderFB*", true, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        return true;
    } catch(...) {
    }
    return false;
}